

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

UniValue * __thiscall RPCResult::MatchesType(RPCResult *this,UniValue *result)

{
  bool bVar1;
  VType VVar2;
  VType VVar3;
  VType *pVVar4;
  size_t sVar5;
  const_reference pvVar6;
  reference pRVar7;
  RPCResult *in_RDX;
  int *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  RPCResult *doc_entry_1;
  vector<RPCResult,_std::allocator<RPCResult>_> *__range2_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *result_entry;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *__range2_1;
  RPCResult *doc_entry;
  vector<RPCResult,_std::allocator<RPCResult>_> *__range2;
  size_t i_1;
  RPCResult *doc_inner_1;
  RPCResult *doc_inner;
  iterator result_it;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  iterator __end2_1;
  iterator __begin2_1;
  const_iterator __end2;
  const_iterator __begin2;
  size_t i;
  optional<UniValue::VType> exp_type;
  UniValue match_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  result_obj;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doc_keys;
  UniValue match_1;
  UniValue errors_1;
  UniValue match;
  UniValue errors;
  UniValue *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  VType in_stack_fffffffffffff8d4;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  UniValue *in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *in_stack_fffffffffffff8f0;
  UniValue *in_stack_fffffffffffff8f8;
  iterator in_stack_fffffffffffff900;
  UniValue *in_stack_fffffffffffff908;
  UniValue *this_00;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  ulong local_5c0;
  UniValue *in_stack_fffffffffffffa68;
  ulong local_510;
  UniValue local_318 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)((long)in_RSI + 0x41) & 1) == 0) {
    ExpectedType((Type)((ulong)in_stack_fffffffffffff908 >> 0x20));
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<UniValue::VType> *)in_stack_fffffffffffff8c8);
    if (bVar1) {
      pVVar4 = std::optional<UniValue::VType>::operator*
                         ((optional<UniValue::VType> *)in_stack_fffffffffffff8c8);
      VVar3 = *pVVar4;
      VVar2 = UniValue::getType(in_stack_fffffffffffff8c8);
      if (VVar3 == VVar2) {
        VVar3 = UniValue::getType(in_stack_fffffffffffff8c8);
        if (VVar3 == VARR) {
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8e0);
          UniValue::UniValue((UniValue *)
                             CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
                             (VType)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                             (string *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8)
                            );
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8c8);
          local_510 = 0;
          while( true ) {
            UniValue::get_array((UniValue *)
                                CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            sVar5 = UniValue::size(in_stack_fffffffffffff8c8);
            if (sVar5 <= local_510) break;
            std::vector<RPCResult,_std::allocator<RPCResult>_>::size
                      ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff8c8);
            std::min<unsigned_long>
                      ((unsigned_long *)
                       CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                       (unsigned_long *)in_stack_fffffffffffff8c8);
            std::vector<RPCResult,_std::allocator<RPCResult>_>::at
                      ((vector<RPCResult,_std::allocator<RPCResult>_> *)
                       CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                       CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            UniValue::get_array((UniValue *)
                                CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            UniValue::operator[]
                      (in_stack_fffffffffffff8e0,
                       CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
            MatchesType(in_RDX,in_stack_fffffffffffffa68);
            bVar1 = UniValue::isTrue((UniValue *)
                                     CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
            if (!bVar1) {
              tinyformat::format<unsigned_long>
                        ((char *)in_stack_fffffffffffff8f8,
                         (unsigned_long *)in_stack_fffffffffffff8f0);
              UniValue::UniValue((UniValue *)
                                 CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                 (UniValue *)
                                 CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              UniValue::pushKV((UniValue *)
                               CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                               (string *)in_stack_fffffffffffff908,
                               (UniValue *)in_stack_fffffffffffff900._M_node);
              UniValue::~UniValue(in_stack_fffffffffffff8c8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff8c8);
            }
            UniValue::~UniValue(in_stack_fffffffffffff8c8);
            local_510 = local_510 + 1;
          }
          bVar1 = UniValue::empty(in_stack_fffffffffffff8c8);
          if (bVar1) {
            UniValue::UniValue<bool,_bool,_true>
                      (in_stack_fffffffffffff908,(bool *)in_stack_fffffffffffff900._M_node);
          }
          else {
            UniValue::UniValue((UniValue *)
                               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                               (UniValue *)
                               CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          }
          UniValue::~UniValue(in_stack_fffffffffffff8c8);
        }
        else {
          VVar3 = UniValue::getType(in_stack_fffffffffffff8c8);
          if (VVar3 == VOBJ) {
            bVar1 = std::vector<RPCResult,_std::allocator<RPCResult>_>::empty
                              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
                               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
            if ((bVar1) ||
               (pvVar6 = std::vector<RPCResult,_std::allocator<RPCResult>_>::at
                                   ((vector<RPCResult,_std::allocator<RPCResult>_> *)
                                    CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                    CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)),
               pvVar6->m_type != ELISION)) {
              std::__cxx11::string::string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff8e0);
              UniValue::UniValue((UniValue *)
                                 CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
                                 (VType)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff8c8);
              if (*in_RSI == 9) {
                std::vector<RPCResult,_std::allocator<RPCResult>_>::at
                          ((vector<RPCResult,_std::allocator<RPCResult>_> *)
                           CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                           CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                local_5c0 = 0;
                while( true ) {
                  UniValue::get_obj((UniValue *)
                                    CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                  sVar5 = UniValue::size(in_stack_fffffffffffff8c8);
                  if (sVar5 <= local_5c0) break;
                  UniValue::get_obj((UniValue *)
                                    CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                  UniValue::operator[]
                            (in_stack_fffffffffffff8e0,
                             CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
                  MatchesType(in_RDX,in_stack_fffffffffffffa68);
                  bVar1 = UniValue::isTrue((UniValue *)
                                           CONCAT17(in_stack_fffffffffffff8df,
                                                    in_stack_fffffffffffff8d8));
                  if (!bVar1) {
                    UniValue::getKeys_abi_cxx11_
                              ((UniValue *)
                               CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                 CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                    std::__cxx11::string::string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff908);
                    UniValue::UniValue((UniValue *)
                                       CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8)
                                       ,(UniValue *)
                                        CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0
                                                ));
                    UniValue::pushKV((UniValue *)
                                     CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                                     (string *)in_stack_fffffffffffff908,
                                     (UniValue *)in_stack_fffffffffffff900._M_node);
                    UniValue::~UniValue(in_stack_fffffffffffff8c8);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff8c8);
                  }
                  UniValue::~UniValue(in_stack_fffffffffffff8c8);
                  local_5c0 = local_5c0 + 1;
                }
                bVar1 = UniValue::empty(in_stack_fffffffffffff8c8);
                if (bVar1) {
                  UniValue::UniValue<bool,_bool,_true>
                            (in_stack_fffffffffffff908,(bool *)in_stack_fffffffffffff900._M_node);
                }
                else {
                  UniValue::UniValue((UniValue *)
                                     CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                     (UniValue *)
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                }
              }
              else {
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff8c8);
                std::vector<RPCResult,_std::allocator<RPCResult>_>::begin
                          ((vector<RPCResult,_std::allocator<RPCResult>_> *)
                           CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                std::vector<RPCResult,_std::allocator<RPCResult>_>::end
                          ((vector<RPCResult,_std::allocator<RPCResult>_> *)
                           CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                while (bVar1 = __gnu_cxx::
                               operator==<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                         ((__normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                           *)CONCAT17(in_stack_fffffffffffff8df,
                                                      in_stack_fffffffffffff8d8),
                                          (__normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff8d4,
                                                      in_stack_fffffffffffff8d0)),
                      ((bVar1 ^ 0xffU) & 1) != 0) {
                  __gnu_cxx::
                  __normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                  ::operator*((__normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                               *)in_stack_fffffffffffff8c8);
                  pVar8 = std::
                          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                   (value_type *)
                                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                  in_stack_fffffffffffff917 = pVar8.second;
                  __gnu_cxx::
                  __normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                  ::operator++((__normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                *)in_stack_fffffffffffff8c8);
                }
                this_00 = local_318;
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                       *)in_stack_fffffffffffff8c8);
                UniValue::getObjMap(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                       *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffff8df,
                                                                 in_stack_fffffffffffff8d8),
                                               (_Self *)CONCAT44(in_stack_fffffffffffff8d4,
                                                                 in_stack_fffffffffffff8d0)),
                      ((bVar1 ^ 0xffU) & 1) != 0) {
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                               *)in_stack_fffffffffffff8c8);
                  in_stack_fffffffffffff900 =
                       std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                  bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffff8df,
                                                            in_stack_fffffffffffff8d8),
                                          (_Self *)CONCAT44(in_stack_fffffffffffff8d4,
                                                            in_stack_fffffffffffff8d0));
                  if (bVar1) {
                    std::__cxx11::string::string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               this_00);
                    UniValue::UniValue<const_char_(&)[33],_char[33],_true>
                              ((UniValue *)
                               CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                               (char (*) [33])this_00);
                    UniValue::pushKV((UniValue *)
                                     CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                                     (string *)this_00,(UniValue *)in_stack_fffffffffffff900._M_node
                                    );
                    UniValue::~UniValue(in_stack_fffffffffffff8c8);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff8c8);
                  }
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                                *)in_stack_fffffffffffff8c8);
                }
                std::vector<RPCResult,_std::allocator<RPCResult>_>::begin
                          ((vector<RPCResult,_std::allocator<RPCResult>_> *)
                           CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                std::vector<RPCResult,_std::allocator<RPCResult>_>::end
                          ((vector<RPCResult,_std::allocator<RPCResult>_> *)
                           CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                while (bVar1 = __gnu_cxx::
                               operator==<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                         ((__normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                           *)CONCAT17(in_stack_fffffffffffff8df,
                                                      in_stack_fffffffffffff8d8),
                                          (__normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff8d4,
                                                      in_stack_fffffffffffff8d0)),
                      ((bVar1 ^ 0xffU) & 1) != 0) {
                  pRVar7 = __gnu_cxx::
                           __normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                           ::operator*((__normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                        *)in_stack_fffffffffffff8c8);
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                          *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         (key_type *)in_stack_fffffffffffff8c8);
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                  bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffff8df,
                                                            in_stack_fffffffffffff8d8),
                                          (_Self *)CONCAT44(in_stack_fffffffffffff8d4,
                                                            in_stack_fffffffffffff8d0));
                  if (bVar1) {
                    if ((pRVar7->m_optional & 1U) == 0) {
                      std::__cxx11::string::string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_00);
                      UniValue::UniValue<const_char_(&)[47],_char[47],_true>
                                ((UniValue *)
                                 CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                                 (char (*) [47])this_00);
                      UniValue::pushKV((UniValue *)
                                       CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910)
                                       ,(string *)this_00,
                                       (UniValue *)in_stack_fffffffffffff900._M_node);
                      UniValue::~UniValue(in_stack_fffffffffffff8c8);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff8c8);
                    }
                  }
                  else {
                    std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                                  *)in_stack_fffffffffffff8c8);
                    MatchesType(in_RDX,in_stack_fffffffffffffa68);
                    bVar1 = UniValue::isTrue((UniValue *)
                                             CONCAT17(in_stack_fffffffffffff8df,
                                                      in_stack_fffffffffffff8d8));
                    if (!bVar1) {
                      std::__cxx11::string::string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_00);
                      UniValue::UniValue((UniValue *)
                                         CONCAT17(in_stack_fffffffffffff8df,
                                                  in_stack_fffffffffffff8d8),
                                         (UniValue *)
                                         CONCAT44(in_stack_fffffffffffff8d4,
                                                  in_stack_fffffffffffff8d0));
                      UniValue::pushKV((UniValue *)
                                       CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910)
                                       ,(string *)this_00,
                                       (UniValue *)in_stack_fffffffffffff900._M_node);
                      UniValue::~UniValue(in_stack_fffffffffffff8c8);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff8c8);
                    }
                    UniValue::~UniValue(in_stack_fffffffffffff8c8);
                  }
                  __gnu_cxx::
                  __normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                  ::operator++((__normal_iterator<const_RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                *)in_stack_fffffffffffff8c8);
                }
                bVar1 = UniValue::empty(in_stack_fffffffffffff8c8);
                if (bVar1) {
                  UniValue::UniValue<bool,_bool,_true>
                            (this_00,(bool *)in_stack_fffffffffffff900._M_node);
                }
                else {
                  UniValue::UniValue((UniValue *)CONCAT17(bVar1,in_stack_fffffffffffff8d8),
                                     (UniValue *)
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                }
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                        *)in_stack_fffffffffffff8c8);
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff8c8);
              }
              UniValue::~UniValue(in_stack_fffffffffffff8c8);
            }
            else {
              UniValue::UniValue<bool,_bool,_true>
                        (in_stack_fffffffffffff908,(bool *)in_stack_fffffffffffff900._M_node);
            }
          }
          else {
            UniValue::UniValue<bool,_bool,_true>
                      (in_stack_fffffffffffff908,(bool *)in_stack_fffffffffffff900._M_node);
          }
        }
      }
      else {
        UniValue::getType(in_stack_fffffffffffff8c8);
        uvTypeName(in_stack_fffffffffffff8d4);
        std::optional<UniValue::VType>::operator*
                  ((optional<UniValue::VType> *)in_stack_fffffffffffff8c8);
        uvTypeName(in_stack_fffffffffffff8d4);
        tinyformat::format<char_const*,char_const*>
                  ((char *)in_stack_fffffffffffff908,(char **)in_stack_fffffffffffff900._M_node,
                   (char **)in_stack_fffffffffffff8f8);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (in_stack_fffffffffffff908,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff900._M_node);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8c8);
      }
    }
    else {
      UniValue::UniValue<bool,_bool,_true>
                (in_stack_fffffffffffff908,(bool *)in_stack_fffffffffffff900._M_node);
    }
  }
  else {
    UniValue::UniValue<bool,_bool,_true>
              (in_stack_fffffffffffff908,(bool *)in_stack_fffffffffffff900._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue RPCResult::MatchesType(const UniValue& result) const
{
    if (m_skip_type_check) {
        return true;
    }

    const auto exp_type = ExpectedType(m_type);
    if (!exp_type) return true; // can be any type, so nothing to check

    if (*exp_type != result.getType()) {
        return strprintf("returned type is %s, but declared as %s in doc", uvTypeName(result.getType()), uvTypeName(*exp_type));
    }

    if (UniValue::VARR == result.getType()) {
        UniValue errors(UniValue::VOBJ);
        for (size_t i{0}; i < result.get_array().size(); ++i) {
            // If there are more results than documented, reuse the last doc_inner.
            const RPCResult& doc_inner{m_inner.at(std::min(m_inner.size() - 1, i))};
            UniValue match{doc_inner.MatchesType(result.get_array()[i])};
            if (!match.isTrue()) errors.pushKV(strprintf("%d", i), std::move(match));
        }
        if (errors.empty()) return true; // empty result array is valid
        return errors;
    }

    if (UniValue::VOBJ == result.getType()) {
        if (!m_inner.empty() && m_inner.at(0).m_type == Type::ELISION) return true;
        UniValue errors(UniValue::VOBJ);
        if (m_type == Type::OBJ_DYN) {
            const RPCResult& doc_inner{m_inner.at(0)}; // Assume all types are the same, randomly pick the first
            for (size_t i{0}; i < result.get_obj().size(); ++i) {
                UniValue match{doc_inner.MatchesType(result.get_obj()[i])};
                if (!match.isTrue()) errors.pushKV(result.getKeys()[i], std::move(match));
            }
            if (errors.empty()) return true; // empty result obj is valid
            return errors;
        }
        std::set<std::string> doc_keys;
        for (const auto& doc_entry : m_inner) {
            doc_keys.insert(doc_entry.m_key_name);
        }
        std::map<std::string, UniValue> result_obj;
        result.getObjMap(result_obj);
        for (const auto& result_entry : result_obj) {
            if (doc_keys.find(result_entry.first) == doc_keys.end()) {
                errors.pushKV(result_entry.first, "key returned that was not in doc");
            }
        }

        for (const auto& doc_entry : m_inner) {
            const auto result_it{result_obj.find(doc_entry.m_key_name)};
            if (result_it == result_obj.end()) {
                if (!doc_entry.m_optional) {
                    errors.pushKV(doc_entry.m_key_name, "key missing, despite not being optional in doc");
                }
                continue;
            }
            UniValue match{doc_entry.MatchesType(result_it->second)};
            if (!match.isTrue()) errors.pushKV(doc_entry.m_key_name, std::move(match));
        }
        if (errors.empty()) return true;
        return errors;
    }

    return true;
}